

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bessel.c
# Opt level: O2

double xc_bessel_I0(double x)

{
  double dVar1;
  double dVar2;
  
  dVar1 = ABS(x);
  if (2.9802322387695312e-08 <= dVar1) {
    if (dVar1 <= 3.0) {
      dVar1 = xc_cheb_eval((x * x) / 4.5 + -1.0,bi0_data,0xc);
      dVar1 = dVar1 + 2.75;
    }
    else if (708.782712893384 <= dVar1) {
      fwrite("Overflow in bessel_I0\n",0x16,1,_stderr);
      dVar1 = 0.0;
    }
    else {
      dVar2 = exp(dVar1);
      dVar1 = xc_bessel_I0_scaled(x);
      dVar1 = dVar1 * dVar2;
    }
  }
  else {
    dVar1 = 1.0;
  }
  return dVar1;
}

Assistant:

GPU_FUNCTION
double xc_bessel_I0(const double x)
{
  double y = fabs(x), r = 0.0;

  if(y < 2.0*SQRT_DBL_EPSILON)
    r = 1.0;
  else if(y <= 3.0)
    r = 2.75 + xc_cheb_eval(y*y/4.5 - 1.0, bi0_data, 12);
  else if(y < LOG_DBL_MAX - 1.0)
    r = exp(y) * xc_bessel_I0_scaled(x);
  else {
#ifndef HAVE_CUDA
    fprintf(stderr, "Overflow in bessel_I0\n");
#endif
  }

  return r;
}